

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::Promise<unsigned_long>_>::truncate
          (ArrayBuilder<kj::Promise<unsigned_long>_> *this,char *__file,__off_t __length)

{
  Promise<unsigned_long> *pPVar1;
  int in_EAX;
  int extraout_EAX;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_00;
  
  pPVar1 = this->ptr;
  while (pPVar1 + (long)__file < this->pos) {
    this_00 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(this->pos + -1);
    this->pos = (RemoveConst<kj::Promise<unsigned_long>_> *)this_00;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }